

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator::GenerateMergingCode
          (ImmutableStringOneofFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_ImmutableStringFieldGenerator).variables_,
                     "$set_oneof_case_message$;\n$oneof_name$_ = other.$oneof_name$_;\n$on_changed$\n"
                    );
  return;
}

Assistant:

void ImmutableStringOneofFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  // Allow a slight breach of abstraction here in order to avoid forcing
  // all string fields to Strings when copying fields from a Message.
  printer->Print(variables_,
    "$set_oneof_case_message$;\n"
    "$oneof_name$_ = other.$oneof_name$_;\n"
    "$on_changed$\n");
}